

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::PromoteAuxBailOut(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  
  if ((this->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd04,"(!this->HasBailOutInfo())","!this->HasBailOutInfo()");
    if (!bVar2) goto LAB_00484673;
    *puVar4 = 0;
  }
  BVar3 = GetAuxBailOutKind(this);
  if (BVar3 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd05,"(this->GetAuxBailOutKind() != IR::BailOutInvalid)",
                       "this->GetAuxBailOutKind() != IR::BailOutInvalid");
    if (!bVar2) {
LAB_00484673:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = GetAuxBailOutKind(this);
  SetBailOutKind_NoAssert(this,BVar3);
  SetAuxBailOutKind(this,BailOutInvalid);
  this->field_0x38 = this->field_0x38 & 0xaf | 0x10;
  return;
}

Assistant:

void Instr::PromoteAuxBailOut()
{
    Assert(!this->HasBailOutInfo());
    Assert(this->GetAuxBailOutKind() != IR::BailOutInvalid);

    this->SetBailOutKind_NoAssert(this->GetAuxBailOutKind());
    this->SetAuxBailOutKind(IR::BailOutInvalid);

    this->hasBailOutInfo = true;
    this->hasAuxBailOut = false;
}